

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.h
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::ConvertToNinjaPath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *path)

{
  pointer pcVar1;
  cmGlobalNinjaGenerator *this_00;
  string *psVar2;
  
  this_00 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  psVar2 = cmGlobalNinjaGenerator::ConvertToNinjaPath(this_00,path);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertToNinjaPath(const std::string& path) const
  {
    return this->GetGlobalGenerator()->ConvertToNinjaPath(path);
  }